

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddCompilerRequirementFlag
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  ostream *poVar7;
  string *psVar8;
  mapped_type *pmVar9;
  iterator iVar10;
  iterator iVar11;
  cmGlobalGenerator *this_00;
  cmake *this_01;
  reference pbVar12;
  cmMakefile *pcVar13;
  allocator local_8c9;
  string local_8c8 [32];
  char *local_8a8;
  char *opt_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  undefined1 local_820 [8];
  string option_flag_2;
  string local_7f8 [32];
  char *local_7d8;
  char *opt_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  undefined1 local_750 [8];
  string option_flag_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  undefined1 local_6a8 [8];
  string e_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_670;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_668;
  const_iterator defaultStdIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  undefined1 local_5e0 [8];
  string e_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5a8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5a0;
  const_iterator stdIt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *stds;
  undefined1 local_588 [8];
  string standard;
  value_type local_560;
  allocator local_539;
  key_type local_538;
  allocator local_511;
  value_type local_510;
  allocator local_4e9;
  key_type local_4e8;
  allocator local_4c1;
  value_type local_4c0;
  allocator local_499;
  key_type local_498;
  allocator local_471;
  value_type local_470;
  allocator local_449;
  key_type local_448;
  allocator local_421;
  value_type local_420;
  allocator local_3f9;
  key_type local_3f8;
  allocator local_3d1;
  value_type local_3d0;
  allocator local_3a9;
  key_type local_3a8;
  allocator local_381;
  string local_380 [32];
  string local_360;
  undefined1 local_340 [8];
  ostringstream e;
  char *opt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  string option_flag;
  char *extPropValue;
  undefined1 local_f0 [6];
  bool ext;
  string type;
  string extProp;
  char *standardProp;
  string stdProp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *local_30;
  char *defaultStd;
  string *lang_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  defaultStd = (char *)lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)flags;
  flags_local = (string *)this;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar13 = this->Makefile;
    std::operator+(&local_70,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)defaultStd);
    std::operator+(&local_50,&local_70,"_STANDARD_DEFAULT");
    pcVar5 = cmMakefile::GetDefinition(pcVar13,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      local_30 = pcVar5;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &standardProp,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)defaultStd
                     ,"_STANDARD");
      pcVar5 = cmGeneratorTarget::GetProperty
                         ((cmGeneratorTarget *)lang_local,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &standardProp);
      if (pcVar5 != (char *)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&type.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       defaultStd,"_EXTENSIONS");
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_f0,"EXTENSION",(allocator *)((long)&extPropValue + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&extPropValue + 7));
        extPropValue._6_1_ = 1;
        pcVar6 = cmGeneratorTarget::GetProperty
                           ((cmGeneratorTarget *)lang_local,(string *)((long)&type.field_2 + 8));
        if ((pcVar6 != (char *)0x0) && (bVar2 = cmSystemTools::IsOff(pcVar6), bVar2)) {
          extPropValue._6_1_ = 0;
          std::__cxx11::string::operator=((string *)local_f0,"STANDARD");
        }
        psVar8 = lang_local;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&option_flag.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       defaultStd,"_STANDARD_REQUIRED");
        bVar2 = cmGeneratorTarget::GetPropertyAsBool
                          ((cmGeneratorTarget *)psVar8,(string *)((long)&option_flag.field_2 + 8));
        std::__cxx11::string::~string((string *)(option_flag.field_2._M_local_buf + 8));
        if (bVar2) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt,
                         "CMAKE_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)defaultStd);
          std::operator+(&local_1a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt,
                         pcVar5);
          std::operator+(&local_180,&local_1a0,"_");
          std::operator+(&local_160,&local_180,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,&local_160,"_COMPILE_OPTION");
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&opt);
          pcVar13 = cmTarget::GetMakefile(*(cmTarget **)lang_local);
          pcVar6 = cmMakefile::GetDefinition(pcVar13,(string *)local_140);
          pcVar1 = target_local;
          if (pcVar6 == (char *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
            poVar7 = std::operator<<((ostream *)local_340,"Target \"");
            psVar8 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)lang_local);
            poVar7 = std::operator<<(poVar7,(string *)psVar8);
            poVar7 = std::operator<<(poVar7,"\" requires the language dialect \"");
            poVar7 = std::operator<<(poVar7,(string *)defaultStd);
            poVar7 = std::operator<<(poVar7,pcVar5);
            poVar7 = std::operator<<(poVar7,"\" ");
            pcVar5 = "";
            if ((extPropValue._6_1_ & 1) != 0) {
              pcVar5 = "(with compiler extensions)";
            }
            poVar7 = std::operator<<(poVar7,pcVar5);
            std::operator<<(poVar7,
                            ", but CMake does not know the compile flags to use to enable it.");
            std::__cxx11::ostringstream::str();
            IssueMessage(this,FATAL_ERROR,&local_360);
            std::__cxx11::string::~string((string *)&local_360);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_380,pcVar6,&local_381);
            (*this->_vptr_cmLocalGenerator[7])(this,pcVar1,local_380);
            std::__cxx11::string::~string(local_380);
            std::allocator<char>::~allocator((allocator<char> *)&local_381);
          }
          std::__cxx11::string::~string((string *)local_140);
        }
        else {
          if ((AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
               ::langStdMap_abi_cxx11_ == '\0') &&
             (iVar3 = __cxa_guard_acquire(&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                           ::langStdMap_abi_cxx11_), iVar3 != 0)) {
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::map(&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                   ::langStdMap_abi_cxx11_);
            __cxa_atexit(std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::~map,&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                 ::langStdMap_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                 ::langStdMap_abi_cxx11_);
          }
          bVar2 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::empty(&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                           ::langStdMap_abi_cxx11_);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_3a8,"CXX",&local_3a9);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                   ::langStdMap_abi_cxx11_,&local_3a8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_3d0,"14",&local_3d1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar9,&local_3d0);
            std::__cxx11::string::~string((string *)&local_3d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
            std::__cxx11::string::~string((string *)&local_3a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_3f8,"CXX",&local_3f9);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                   ::langStdMap_abi_cxx11_,&local_3f8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_420,"11",&local_421);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar9,&local_420);
            std::__cxx11::string::~string((string *)&local_420);
            std::allocator<char>::~allocator((allocator<char> *)&local_421);
            std::__cxx11::string::~string((string *)&local_3f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_448,"CXX",&local_449);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                   ::langStdMap_abi_cxx11_,&local_448);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_470,"98",&local_471);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar9,&local_470);
            std::__cxx11::string::~string((string *)&local_470);
            std::allocator<char>::~allocator((allocator<char> *)&local_471);
            std::__cxx11::string::~string((string *)&local_448);
            std::allocator<char>::~allocator((allocator<char> *)&local_449);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_498,"C",&local_499);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                   ::langStdMap_abi_cxx11_,&local_498);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4c0,"11",&local_4c1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar9,&local_4c0);
            std::__cxx11::string::~string((string *)&local_4c0);
            std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
            std::__cxx11::string::~string((string *)&local_498);
            std::allocator<char>::~allocator((allocator<char> *)&local_499);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4e8,"C",&local_4e9);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                   ::langStdMap_abi_cxx11_,&local_4e8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_510,"99",&local_511);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar9,&local_510);
            std::__cxx11::string::~string((string *)&local_510);
            std::allocator<char>::~allocator((allocator<char> *)&local_511);
            std::__cxx11::string::~string((string *)&local_4e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_538,"C",&local_539);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                   ::langStdMap_abi_cxx11_,&local_538);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_560,"90",(allocator *)(standard.field_2._M_local_buf + 0xf))
            ;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar9,&local_560);
            std::__cxx11::string::~string((string *)&local_560);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(standard.field_2._M_local_buf + 0xf));
            std::__cxx11::string::~string((string *)&local_538);
            std::allocator<char>::~allocator((allocator<char> *)&local_539);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_588,pcVar5,(allocator *)((long)&stds + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&stds + 7));
          stdIt._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                             ::langStdMap_abi_cxx11_,(key_type *)defaultStd);
          iVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)stdIt._M_current);
          iVar11 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(stdIt._M_current);
          local_5a8 = std::
                      find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                (iVar10._M_current,iVar11._M_current,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_588);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_5a0,&local_5a8);
          e_1.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)stdIt._M_current);
          bVar2 = __gnu_cxx::operator==
                            (&local_5a0,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&e_1.field_2 + 8));
          if (bVar2) {
            std::operator+(&local_620,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           defaultStd,"_STANDARD is set to invalid value \'");
            std::operator+(&local_600,&local_620,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_588);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5e0,&local_600,"\'");
            std::__cxx11::string::~string((string *)&local_600);
            std::__cxx11::string::~string((string *)&local_620);
            this_00 = GetGlobalGenerator(this);
            this_01 = cmGlobalGenerator::GetCMakeInstance(this_00);
            cmGeneratorTarget::GetBacktrace
                      ((cmListFileBacktrace *)&defaultStdIt,(cmGeneratorTarget *)lang_local);
            cmake::IssueMessage(this_01,FATAL_ERROR,(string *)local_5e0,
                                (cmListFileBacktrace *)&defaultStdIt,false);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&defaultStdIt);
            std::__cxx11::string::~string((string *)local_5e0);
          }
          else {
            iVar10 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(stdIt._M_current);
            iVar11 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(stdIt._M_current);
            local_670 = std::
                        find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char_const*>
                                  (iVar10._M_current,iVar11._M_current,&local_30);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_668,&local_670);
            e_2.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)stdIt._M_current);
            bVar2 = __gnu_cxx::operator==
                              (&local_668,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&e_2.field_2 + 8));
            if (bVar2) {
              std::operator+(&local_708,"CMAKE_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             defaultStd);
              std::operator+(&local_6e8,&local_708,"_STANDARD_DEFAULT is set to invalid value \'");
              pcVar5 = local_30;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_728,pcVar5,
                         (allocator *)(option_flag_1.field_2._M_local_buf + 0xf));
              std::operator+(&local_6c8,&local_6e8,&local_728);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6a8,&local_6c8,"\'");
              std::__cxx11::string::~string((string *)&local_6c8);
              std::__cxx11::string::~string((string *)&local_728);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(option_flag_1.field_2._M_local_buf + 0xf));
              std::__cxx11::string::~string((string *)&local_6e8);
              std::__cxx11::string::~string((string *)&local_708);
              IssueMessage(this,INTERNAL_ERROR,(string *)local_6a8);
              std::__cxx11::string::~string((string *)local_6a8);
            }
            else {
              bVar2 = __gnu_cxx::operator>=(&local_5a0,&local_668);
              if (bVar2) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &opt_1,"CMAKE_",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               defaultStd);
                pbVar12 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_5a0);
                std::operator+(&local_7b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &opt_1,pbVar12);
                std::operator+(&local_790,&local_7b0,"_");
                std::operator+(&local_770,&local_790,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f0);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_750,&local_770,"_COMPILE_OPTION");
                std::__cxx11::string::~string((string *)&local_770);
                std::__cxx11::string::~string((string *)&local_790);
                std::__cxx11::string::~string((string *)&local_7b0);
                std::__cxx11::string::~string((string *)&opt_1);
                pcVar13 = cmTarget::GetMakefile(*(cmTarget **)lang_local);
                pcVar5 = cmMakefile::GetRequiredDefinition(pcVar13,(string *)local_750);
                pcVar1 = target_local;
                local_7d8 = pcVar5;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_7f8,pcVar5,(allocator *)(option_flag_2.field_2._M_local_buf + 0xf))
                ;
                (*this->_vptr_cmLocalGenerator[7])(this,pcVar1,local_7f8);
                std::__cxx11::string::~string(local_7f8);
                std::allocator<char>::~allocator
                          ((allocator<char> *)(option_flag_2.field_2._M_local_buf + 0xf));
                std::__cxx11::string::~string((string *)local_750);
              }
              else {
                while (bVar2 = __gnu_cxx::operator<(&local_5a0,&local_668), bVar2) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&opt_2,"CMAKE_",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)defaultStd);
                  pbVar12 = __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&local_5a0);
                  std::operator+(&local_880,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&opt_2,pbVar12);
                  std::operator+(&local_860,&local_880,"_");
                  std::operator+(&local_840,&local_860,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_f0);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_820,&local_840,"_COMPILE_OPTION");
                  std::__cxx11::string::~string((string *)&local_840);
                  std::__cxx11::string::~string((string *)&local_860);
                  std::__cxx11::string::~string((string *)&local_880);
                  std::__cxx11::string::~string((string *)&opt_2);
                  pcVar13 = cmTarget::GetMakefile(*(cmTarget **)lang_local);
                  pcVar5 = cmMakefile::GetDefinition(pcVar13,(string *)local_820);
                  pcVar1 = target_local;
                  local_8a8 = pcVar5;
                  if (pcVar5 != (char *)0x0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_8c8,pcVar5,&local_8c9);
                    (*this->_vptr_cmLocalGenerator[7])(this,pcVar1,local_8c8);
                    std::__cxx11::string::~string(local_8c8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
                  }
                  std::__cxx11::string::~string((string *)local_820);
                  if (pcVar5 != (char *)0x0) break;
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_5a0);
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)local_588);
        }
        std::__cxx11::string::~string((string *)local_f0);
        std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)&standardProp);
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::
AddCompilerRequirementFlag(std::string &flags,
                           cmGeneratorTarget const* target,
                           const std::string& lang)
{
  if (lang.empty())
    {
    return;
    }
  const char* defaultStd
      = this->Makefile->GetDefinition("CMAKE_" + lang + "_STANDARD_DEFAULT");
  if (!defaultStd || !*defaultStd)
    {
    // This compiler has no notion of language standard levels.
    return;
    }
  std::string stdProp = lang + "_STANDARD";
  const char *standardProp = target->GetProperty(stdProp);
  if (!standardProp)
    {
    return;
    }
  std::string extProp = lang + "_EXTENSIONS";
  std::string type = "EXTENSION";
  bool ext = true;
  if (const char* extPropValue = target->GetProperty(extProp))
    {
    if (cmSystemTools::IsOff(extPropValue))
      {
      ext = false;
      type = "STANDARD";
      }
    }

  if (target->GetPropertyAsBool(lang + "_STANDARD_REQUIRED"))
    {
    std::string option_flag =
              "CMAKE_" + lang + standardProp
                      + "_" + type + "_COMPILE_OPTION";

    const char *opt = target->Target->GetMakefile()
        ->GetDefinition(option_flag);
    if (!opt)
      {
      std::ostringstream e;
      e << "Target \"" << target->GetName() << "\" requires the language "
           "dialect \"" << lang << standardProp << "\" "
        << (ext ? "(with compiler extensions)" : "") << ", but CMake "
           "does not know the compile flags to use to enable it.";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      }
    else
      {
      this->AppendFlagEscape(flags, opt);
      }
    return;
    }

  static std::map<std::string, std::vector<std::string> > langStdMap;
  if (langStdMap.empty())
    {
    // Maintain sorted order, most recent first.
    langStdMap["CXX"].push_back("14");
    langStdMap["CXX"].push_back("11");
    langStdMap["CXX"].push_back("98");

    langStdMap["C"].push_back("11");
    langStdMap["C"].push_back("99");
    langStdMap["C"].push_back("90");
    }

  std::string standard(standardProp);

  std::vector<std::string>& stds = langStdMap[lang];

  std::vector<std::string>::const_iterator stdIt =
                                std::find(stds.begin(), stds.end(), standard);
  if (stdIt == stds.end())
    {
    std::string e =
      lang + "_STANDARD is set to invalid value '" + standard + "'";
    this->GetGlobalGenerator()->GetCMakeInstance()
      ->IssueMessage(cmake::FATAL_ERROR, e, target->GetBacktrace());
    return;
    }

  std::vector<std::string>::const_iterator defaultStdIt =
    std::find(stds.begin(), stds.end(), defaultStd);
  if (defaultStdIt == stds.end())
    {
    std::string e =
      "CMAKE_" + lang + "_STANDARD_DEFAULT is set to invalid value '" +
      std::string(defaultStd) + "'";
    this->IssueMessage(cmake::INTERNAL_ERROR, e);
    return;
    }

  // Greater or equal because the standards are stored in
  // backward chronological order.
  if (stdIt >= defaultStdIt)
    {
    std::string option_flag =
              "CMAKE_" + lang + *stdIt
                      + "_" + type + "_COMPILE_OPTION";

    const char *opt =
        target->Target->GetMakefile()->GetRequiredDefinition(option_flag);
    this->AppendFlagEscape(flags, opt);
    return;
    }

  for ( ; stdIt < defaultStdIt; ++stdIt)
    {
    std::string option_flag =
              "CMAKE_" + lang + *stdIt
                      + "_" + type + "_COMPILE_OPTION";

    if (const char *opt = target->Target
        ->GetMakefile()->GetDefinition(option_flag))
      {
      this->AppendFlagEscape(flags, opt);
      return;
      }
    }
}